

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanCommandBuffer::EndRendering(VulkanCommandBuffer *this)

{
  Char *pCVar1;
  char (*in_RCX) [32];
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"EndRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x176);
    std::__cxx11::string::~string((string *)local_30);
  }
  if ((this->m_State).DynamicRenderingHash == 0) {
    Diligent::FormatString<char[24]>((string *)local_60,(char (*) [24])"Rendering has not begun");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"EndRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x177);
    std::__cxx11::string::~string((string *)local_60);
  }
  (*vkCmdEndRenderingKHR)(this->m_VkCmdBuffer);
  (this->m_State).DynamicRenderingHash = 0;
  return;
}

Assistant:

__forceinline void EndRendering()
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(m_State.DynamicRenderingHash != 0, "Rendering has not begun");
        vkCmdEndRenderingKHR(m_VkCmdBuffer);
        m_State.DynamicRenderingHash = 0;
    }